

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool google::protobuf::io::Tokenizer::IsIdentifier(string *text)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  string local_38;
  string *local_18;
  string *text_local;
  
  local_18 = text;
  lVar2 = std::__cxx11::string::size();
  if (lVar2 == 0) {
    text_local._7_1_ = false;
  }
  else {
    pcVar3 = (char *)std::__cxx11::string::at((ulong)local_18);
    bVar1 = anon_unknown_4::Letter::InClass(*pcVar3);
    if (bVar1) {
      std::__cxx11::string::substr((ulong)&local_38,(ulong)local_18);
      bVar1 = AllInClass<google::protobuf::io::(anonymous_namespace)::Alphanumeric>(&local_38);
      std::__cxx11::string::~string((string *)&local_38);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        text_local._7_1_ = true;
      }
      else {
        text_local._7_1_ = false;
      }
    }
    else {
      text_local._7_1_ = false;
    }
  }
  return text_local._7_1_;
}

Assistant:

bool Tokenizer::IsIdentifier(const string& text) {
  // Mirrors IDENTIFIER definition in Tokenizer::Next() above.
  if (text.size() == 0)
    return false;
  if (!Letter::InClass(text.at(0)))
    return false;
  if (!AllInClass<Alphanumeric>(text.substr(1)))
    return false;
  return true;
}